

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getline.c
# Opt level: O3

void hooked_curses_getlin(char *query,char *buf,getlin_hook_proc hook,void *hook_proc_arg)

{
  int iVar1;
  bool bVar2;
  char cVar3;
  undefined4 uVar4;
  wchar_t wVar5;
  gamewin *gw;
  WINDOW *pWVar6;
  size_t sVar7;
  long lVar8;
  size_t sVar9;
  long lVar10;
  wchar_t output_count;
  char **output;
  wchar_t local_3c;
  char **local_38;
  
  uVar4 = curs_set(1);
  ui_wrap_text(L'L',query,&local_3c,&local_38);
  ui_free_wrap(local_38);
  gw = alloc_gamewin(L'\x18');
  pWVar6 = newdialog(local_3c + L'\x03',L'P');
  gw->win = pWVar6;
  gw->draw = draw_getline;
  gw->resize = resize_getline;
  gw[1].draw = (_func_void_gamewin_ptr *)buf;
  gw[1].resize = (_func_void_gamewin_ptr *)query;
  *buf = '\0';
  sVar9 = 0;
  do {
    bVar2 = false;
    cVar3 = '\0';
LAB_00109aa8:
    bVar2 = !bVar2;
    sVar7 = sVar9;
LAB_00109ab0:
    sVar9 = sVar7;
    if (!bVar2) {
      curs_set(uVar4);
      delwin(gw->win);
      delete_gamewin(gw);
      redraw_game_windows();
      return;
    }
LAB_00109abb:
    draw_getline(gw);
    wVar5 = nh_wgetch(gw->win);
    if (wVar5 < L'Ą') {
      if (wVar5 != L'\x7f') {
        if (wVar5 != L'\r') {
          if (wVar5 != L'\x1b') goto switchD_00109af0_default;
          buf[0] = '\x1b';
          buf[1] = '\0';
        }
LAB_00109bfd:
        bVar2 = true;
        goto LAB_00109aa8;
      }
switchD_00109af0_caseD_107:
      if (*(int *)&gw[1].win != 0) break;
      goto LAB_00109abb;
    }
    if (wVar5 < L'Ŋ') {
      switch(wVar5) {
      case L'Ą':
        bVar2 = false;
        if (0 < *(int *)&gw[1].win) {
          *(int *)&gw[1].win = *(int *)&gw[1].win + -1;
          bVar2 = false;
        }
        goto LAB_00109aa8;
      case L'ą':
        bVar2 = false;
        if ((ulong)(long)*(int *)&gw[1].win < sVar9) {
          *(int *)&gw[1].win = *(int *)&gw[1].win + 1;
          bVar2 = false;
        }
        goto LAB_00109aa8;
      case L'Ć':
        *(undefined4 *)&gw[1].win = 0;
        bVar2 = false;
        goto LAB_00109aa8;
      case L'ć':
        goto switchD_00109af0_caseD_107;
      }
    }
    else {
      if (wVar5 == L'Ŋ') goto LAB_00109b5f;
      if (wVar5 == L'ŗ') goto LAB_00109bfd;
      if (wVar5 == L'Ũ') {
        *(int *)&gw[1].win = (int)sVar9;
        bVar2 = false;
        goto LAB_00109aa8;
      }
    }
switchD_00109af0_default:
    if ((uint)(wVar5 + L'\xffffff81') < 0xffffffa1) goto LAB_00109abb;
    iVar1 = *(int *)&gw[1].win;
    lVar10 = (long)iVar1;
    if (0xfd < lVar10) goto LAB_00109abb;
    sVar7 = strlen(buf);
    if (iVar1 <= (int)sVar7) {
      lVar8 = (long)(int)sVar7 + 1;
      do {
        buf[lVar8] = buf[lVar8 + -1];
        lVar8 = lVar8 + -1;
      } while (lVar10 < lVar8);
    }
    buf[lVar10] = (char)wVar5;
    lVar10 = (long)*(int *)&gw[1].win + 1;
    *(int *)&gw[1].win = (int)lVar10;
    if (hook != (getlin_hook_proc)0x0) {
      if (cVar3 != '\0') {
        buf[lVar10] = '\0';
      }
      cVar3 = (*hook)(buf,hook_proc_arg);
      sVar9 = strlen(buf);
      bVar2 = false;
      goto LAB_00109aa8;
    }
    sVar9 = sVar9 + 1;
  } while( true );
  *(int *)&gw[1].win = *(int *)&gw[1].win + -1;
LAB_00109b5f:
  bVar2 = true;
  sVar7 = 0;
  if (sVar9 != 0) goto code_r0x00109b6f;
  goto LAB_00109ab0;
code_r0x00109b6f:
  sVar9 = sVar9 - 1;
  iVar1 = *(int *)&gw[1].win;
  sVar7 = strlen(buf);
  bVar2 = false;
  if (iVar1 <= (int)sVar7) {
    lVar10 = 0;
    do {
      buf[lVar10 + iVar1] = buf[lVar10 + (long)iVar1 + 1];
      lVar10 = lVar10 + 1;
      bVar2 = false;
    } while (((int)sVar7 - iVar1) + 1 != (int)lVar10);
  }
  goto LAB_00109aa8;
}

Assistant:

static void hooked_curses_getlin(const char *query, char *buf,
		       getlin_hook_proc hook, void *hook_proc_arg)
{
    struct gamewin *gw;
    struct win_getline *gldat;
    int height, width, key, prev_curs;
    size_t len = 0;
    nh_bool done = FALSE;
    nh_bool autocomplete = FALSE;
    char **output;
    int output_count;

    prev_curs = curs_set(1);

    /* wrap text just for determining dimensions */
    ui_wrap_text(COLNO - 4, query, &output_count, &output);
    ui_free_wrap(output);
    height = output_count + 3;
    width = COLNO;

    gw = alloc_gamewin(sizeof(struct win_getline));
    gw->win = newdialog(height, width);
    gw->draw = draw_getline;
    gw->resize = resize_getline;
    gldat = (struct win_getline *)gw->extra;
    gldat->buf = buf;
    gldat->query = query;
    
    buf[0] = 0;
    while (!done) {
	draw_getline(gw);
	key = nh_wgetch(gw->win);
	
	switch (key) {
	    case KEY_ESC:
		buf[0] = (char)key;
		buf[1] = 0;
		done = TRUE;
		break;
		
	    case KEY_ENTER:
	    case '\r':
		done = TRUE;
		break;

	    case KEY_BACKSPACE: /* different terminals send different codes... */
	    case KEY_BACKDEL:
		if (gldat->pos == 0) continue;
		gldat->pos--;
		/* fall through */
	    case KEY_DC:
		if (len == 0) continue;
		len--;
		buf_delete(buf, gldat->pos);
		break;
		
	    case KEY_LEFT:
		if (gldat->pos > 0) gldat->pos--;
		break;
		
	    case KEY_RIGHT:
		if (gldat->pos < len) gldat->pos++;
		break;
		
	    case KEY_HOME:
		gldat->pos = 0;
		break;
		
	    case KEY_END:
		gldat->pos = len;
		break;
		
	    default:
		if (' ' > (unsigned) key || (unsigned)key >= 128 || 
		    key == KEY_BACKDEL || gldat->pos >= BUFSZ-2)
		    continue;
		buf_insert(buf, gldat->pos, key);
		gldat->pos++;
		len++;
		
		if (hook) {
		    if (autocomplete)
			/* discard previous completion before looking for a new one */
			buf[gldat->pos] = '\0';
		    
		    autocomplete = (*hook)(buf, hook_proc_arg);
		    len = strlen(buf); /* (*hook) may modify buf */
		} else
		    autocomplete = FALSE;
		
		break;
	}
    }
    
    curs_set(prev_curs);
    
    delwin(gw->win);
    delete_gamewin(gw);
    redraw_game_windows();
}